

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O3

int bin_mdef_free(bin_mdef_t *m)

{
  int iVar1;
  int iVar2;
  cd_tree_t **ppcVar3;
  
  if (m == (bin_mdef_t *)0x0) {
    return 0;
  }
  iVar2 = m->refcnt;
  iVar1 = iVar2 + -1;
  m->refcnt = iVar1;
  if (1 < iVar2) {
    return iVar1;
  }
  if (m->alloc_mode == BIN_MDEF_IN_MEMORY) {
    ppcVar3 = (cd_tree_t **)m->ciname;
  }
  else {
    if (m->alloc_mode != BIN_MDEF_FROM_TEXT) goto LAB_00103aca;
    ckd_free(*m->ciname);
    ckd_free(*m->sseq);
    ckd_free(m->phone);
    ppcVar3 = &m->cd_tree;
  }
  ckd_free(*ppcVar3);
LAB_00103aca:
  if (m->filemap != (mmio_file_t *)0x0) {
    mmio_file_unmap(m->filemap);
  }
  ckd_free(m->cd2cisen);
  ckd_free(m->sen2cimap);
  ckd_free(m->ciname);
  ckd_free(m->sseq);
  ckd_free(m);
  return 0;
}

Assistant:

int
bin_mdef_free(bin_mdef_t * m)
{
    if (m == NULL)
        return 0;
    if (--m->refcnt > 0)
        return m->refcnt;

    switch (m->alloc_mode) {
    case BIN_MDEF_FROM_TEXT:
        ckd_free(m->ciname[0]);
        ckd_free(m->sseq[0]);
        ckd_free(m->phone);
        ckd_free(m->cd_tree);
        break;
    case BIN_MDEF_IN_MEMORY:
        ckd_free(m->ciname[0]);
        break;
    case BIN_MDEF_ON_DISK:
        break;
    }
    if (m->filemap)
        mmio_file_unmap(m->filemap);
    ckd_free(m->cd2cisen);
    ckd_free(m->sen2cimap);
    ckd_free(m->ciname);
    ckd_free(m->sseq);
    ckd_free(m);
    return 0;
}